

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::getVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  aiVector3t<float> local_30;
  ai_real local_24;
  ai_real local_20;
  ai_real z;
  ai_real y;
  ai_real x;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_local;
  ObjFileParser *this_local;
  
  _y = point3d_array;
  point3d_array_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this;
  copyNextWord(this,this->m_buffer,0x1000);
  z = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_20 = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_24 = fast_atof(this->m_buffer);
  this_00 = _y;
  aiVector3t<float>::aiVector3t(&local_30,z,local_20,local_24);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(this_00,&local_30);
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array.push_back( aiVector3D( x, y, z ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}